

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

OlsonTimeZone * __thiscall
icu_63::OlsonTimeZone::operator=(OlsonTimeZone *this,OlsonTimeZone *other)

{
  int iVar1;
  undefined4 extraout_var;
  SimpleTimeZone *pSVar2;
  
  this->canonicalID = other->canonicalID;
  this->transitionTimesPre32 = other->transitionTimesPre32;
  this->transitionTimes32 = other->transitionTimes32;
  this->transitionTimesPost32 = other->transitionTimesPost32;
  this->transitionCountPre32 = other->transitionCountPre32;
  this->transitionCount32 = other->transitionCount32;
  this->transitionCountPost32 = other->transitionCountPost32;
  this->typeCount = other->typeCount;
  this->typeOffsets = other->typeOffsets;
  this->typeMapData = other->typeMapData;
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[1])();
  }
  if (other->finalZone == (SimpleTimeZone *)0x0) {
    pSVar2 = (SimpleTimeZone *)0x0;
  }
  else {
    iVar1 = (*(other->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject
              [0xc])();
    pSVar2 = (SimpleTimeZone *)CONCAT44(extraout_var,iVar1);
  }
  this->finalZone = pSVar2;
  this->finalStartYear = other->finalStartYear;
  this->finalStartMillis = other->finalStartMillis;
  this->finalZoneWithStartYear = (SimpleTimeZone *)0x0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTZTransition = (TimeZoneTransition *)0x0;
  this->firstTZTransitionIdx = 0;
  this->firstFinalTZTransition = (TimeZoneTransition *)0x0;
  this->historicRules = (TimeArrayTimeZoneRule **)0x0;
  this->historicRuleCount = 0;
  LOCK();
  (this->transitionRulesInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  return this;
}

Assistant:

OlsonTimeZone& OlsonTimeZone::operator=(const OlsonTimeZone& other) {
    canonicalID = other.canonicalID;

    transitionTimesPre32 = other.transitionTimesPre32;
    transitionTimes32 = other.transitionTimes32;
    transitionTimesPost32 = other.transitionTimesPost32;

    transitionCountPre32 = other.transitionCountPre32;
    transitionCount32 = other.transitionCount32;
    transitionCountPost32 = other.transitionCountPost32;

    typeCount = other.typeCount;
    typeOffsets = other.typeOffsets;
    typeMapData = other.typeMapData;

    delete finalZone;
    finalZone = (other.finalZone != 0) ?
        (SimpleTimeZone*) other.finalZone->clone() : 0;

    finalStartYear = other.finalStartYear;
    finalStartMillis = other.finalStartMillis;

    clearTransitionRules();

    return *this;
}